

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

Fl_Type * __thiscall Fl_Decl_Type::make(Fl_Decl_Type *this)

{
  Fl_Type *p;
  int iVar1;
  Fl_Decl_Type *this_00;
  Fl_Type **ppFVar2;
  
  ppFVar2 = &Fl_Type::current;
  while (p = *ppFVar2, p != (Fl_Type *)0x0) {
    iVar1 = (*p->_vptr_Fl_Type[0x24])(p);
    if (iVar1 != 0) break;
    ppFVar2 = &p->parent;
  }
  this_00 = (Fl_Decl_Type *)operator_new(0x80);
  (this_00->super_Fl_Type)._vptr_Fl_Type = (_func_int **)0x0;
  (this_00->super_Fl_Type).name_ = (char *)0x0;
  (this_00->super_Fl_Type).label_ = (char *)0x0;
  (this_00->super_Fl_Type).callback_ = (char *)0x0;
  (this_00->super_Fl_Type).user_data_ = (char *)0x0;
  (this_00->super_Fl_Type).user_data_type_ = (char *)0x0;
  (this_00->super_Fl_Type).comment_ = (char *)0x0;
  (this_00->super_Fl_Type).parent = (Fl_Type *)0x0;
  (this_00->super_Fl_Type).new_selected = '\0';
  (this_00->super_Fl_Type).selected = '\0';
  (this_00->super_Fl_Type).open_ = '\0';
  (this_00->super_Fl_Type).visible = '\0';
  (this_00->super_Fl_Type).rtti = '\0';
  *(undefined3 *)&(this_00->super_Fl_Type).field_0x45 = 0;
  *(undefined8 *)&(this_00->super_Fl_Type).level = 0;
  (this_00->super_Fl_Type).next = (Fl_Type *)0x0;
  (this_00->super_Fl_Type).prev = (Fl_Type *)0x0;
  (this_00->super_Fl_Type).factory = (Fl_Type *)0x0;
  (this_00->super_Fl_Type).code_position = 0;
  (this_00->super_Fl_Type).header_position = 0;
  (this_00->super_Fl_Type).code_position_end = 0;
  (this_00->super_Fl_Type).header_position_end = 0;
  this_00->public_ = '\0';
  this_00->static_ = '\0';
  *(undefined6 *)&this_00->field_0x7a = 0;
  Fl_Decl_Type(this_00);
  this_00->public_ = '\0';
  this_00->static_ = '\x01';
  Fl_Type::name((Fl_Type *)this_00,"int x;");
  Fl_Type::add((Fl_Type *)this_00,p);
  (this_00->super_Fl_Type).factory = &this->super_Fl_Type;
  return &this_00->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_Decl_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_decl_block()) p = p->parent;
  Fl_Decl_Type *o = new Fl_Decl_Type();
  o->public_ = 0;
  o->static_ = 1;
  o->name("int x;");
  o->add(p);
  o->factory = this;
  return o;
}